

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void async_example(void)

{
  int iVar1;
  format_string_t<int_&> fmt;
  allocator local_ea;
  allocator local_e9;
  shared_ptr<spdlog::logger> async_file;
  string local_d8 [32];
  filename_t local_b8;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  std::__cxx11::string::string((string *)&local_b8,"async_file_logger",&local_e9);
  std::__cxx11::string::string(local_d8,"logs/async_log.txt",&local_ea);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  spdlog::basic_logger_mt<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
            ((string *)&async_file,&local_b8,SUB81(local_d8,0),(file_event_handlers *)0x0);
  spdlog::file_event_handlers::~file_event_handlers((file_event_handlers *)&local_98);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  iVar1 = 1;
  while (local_98._0_4_ = iVar1, iVar1 < 0x65) {
    fmt.str.size_ = 0x11;
    fmt.str.data_ = "Async message #{}";
    spdlog::logger::info<int&>
              (async_file.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,fmt,
               (int *)local_98._M_pod_data);
    iVar1 = local_98._0_4_ + 1;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&async_file.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return;
}

Assistant:

void async_example() {
    // Default thread pool settings can be modified *before* creating the async logger:
    // spdlog::init_thread_pool(32768, 1); // queue with max 32k items 1 backing thread.
    auto async_file =
        spdlog::basic_logger_mt<spdlog::async_factory>("async_file_logger", "logs/async_log.txt");
    // alternatively:
    // auto async_file =
    // spdlog::create_async<spdlog::sinks::basic_file_sink_mt>("async_file_logger",
    // "logs/async_log.txt");

    for (int i = 1; i < 101; ++i) {
        async_file->info("Async message #{}", i);
    }
}